

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

If_DsdMan_t * If_DsdManAlloc(int nVars,int LutSize)

{
  word wVar1;
  uint uVar2;
  If_DsdMan_t *p;
  size_t sVar3;
  char *__dest;
  uint *puVar4;
  Mem_Flex_t *pMVar5;
  void **ppvVar6;
  int *piVar7;
  If_DsdObj_t *pIVar8;
  Vec_Int_t *pVVar9;
  Vec_Mem_t *pVVar10;
  Vec_Ptr_t *pVVar11;
  void *pvVar12;
  uint uVar13;
  undefined8 *puVar14;
  int i;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  char pFileName [100];
  char local_98 [104];
  
  if (0xc < nVars) {
    __assert_fail("nVars <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x10c,"If_DsdMan_t *If_DsdManAlloc(int, int)");
  }
  sprintf(local_98,"%02d.dsd",(ulong)(uint)nVars);
  p = (If_DsdMan_t *)calloc(1,0x2d0);
  sVar3 = strlen(local_98);
  __dest = (char *)malloc(sVar3 + 1);
  strcpy(__dest,local_98);
  p->pStore = __dest;
  p->nVars = nVars;
  p->LutSize = LutSize;
  iVar18 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar18 = 1;
  }
  p->nWords = iVar18;
  uVar13 = 99999;
  while( true ) {
    do {
      uVar17 = uVar13 + 1;
      uVar2 = uVar13 & 1;
      uVar13 = uVar17;
    } while (uVar2 != 0);
    if (uVar17 < 9) break;
    iVar18 = 5;
    while (uVar17 % (iVar18 - 2U) != 0) {
      uVar2 = iVar18 * iVar18;
      iVar18 = iVar18 + 2;
      if (uVar17 < uVar2) goto LAB_0041d8f6;
    }
  }
LAB_0041d8f6:
  p->nBins = uVar17;
  puVar4 = (uint *)calloc((long)(int)uVar17,4);
  p->pBins = puVar4;
  pMVar5 = Mem_FlexStart();
  p->pMem = pMVar5;
  p->nConfigWords = 1;
  if ((p->vObjs).nCap < 10000) {
    ppvVar6 = (p->vObjs).pArray;
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc(80000);
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,80000);
    }
    (p->vObjs).pArray = ppvVar6;
    (p->vObjs).nCap = 10000;
  }
  if ((p->vNexts).nCap < 10000) {
    piVar7 = (p->vNexts).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(40000);
    }
    else {
      piVar7 = (int *)realloc(piVar7,40000);
    }
    (p->vNexts).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0041dcfb;
    (p->vNexts).nCap = 10000;
  }
  if ((p->vTruths).nCap < 10000) {
    piVar7 = (p->vTruths).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(40000);
    }
    else {
      piVar7 = (int *)realloc(piVar7,40000);
    }
    (p->vTruths).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_0041dcfb:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vTruths).nCap = 10000;
  }
  If_DsdObjAlloc(p,1,0);
  pIVar8 = If_DsdObjAlloc(p,2,0);
  *(uint *)&pIVar8->field_0x4 = *(uint *)&pIVar8->field_0x4 & 0xffffff07 | 8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x20;
  pVVar9->nSize = 0;
  piVar7 = (int *)malloc(0x80);
  pVVar9->pArray = piVar7;
  p->vTemp1 = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x20;
  pVVar9->nSize = 0;
  piVar7 = (int *)malloc(0x80);
  pVVar9->pArray = piVar7;
  p->vTemp2 = pVVar9;
  if (If_ManDsdTtElems_pTtElems == 0) {
    puVar14 = &If_ManDsdTtElems_TtElems;
    lVar15 = 0;
    do {
      *(undefined8 **)((long)&If_ManDsdTtElems_pTtElems + lVar15) = puVar14;
      lVar15 = lVar15 + 8;
      puVar14 = puVar14 + 0x40;
    } while (lVar15 != 0x68);
    uVar16 = 0;
    do {
      if (uVar16 < 6) {
        wVar1 = s_Truths6[uVar16];
        lVar15 = (&If_ManDsdTtElems_pTtElems)[uVar16];
        lVar19 = 0;
        do {
          *(word *)(lVar15 + lVar19 * 8) = wVar1;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x40);
      }
      else {
        lVar15 = (&If_ManDsdTtElems_pTtElems)[uVar16];
        lVar19 = 0;
        do {
          *(ulong *)(lVar15 + lVar19 * 8) =
               -(ulong)((1 << ((char)uVar16 - 6U & 0x1f) & (uint)lVar19) != 0);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x40);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0xc);
  }
  p->pTtElems = (word **)&If_ManDsdTtElems_pTtElems;
  if (2 < nVars) {
    uVar16 = 3;
    do {
      iVar18 = 1 << ((char)uVar16 - 6U & 0x1f);
      if (uVar16 < 7) {
        iVar18 = 1;
      }
      pVVar10 = (Vec_Mem_t *)calloc(1,0x30);
      pVVar10->nEntrySize = iVar18;
      pVVar10->LogPageSze = 0xc;
      pVVar10->PageMask = 0xfff;
      pVVar10->iPage = -1;
      p->vTtMem[uVar16] = pVVar10;
      if ((pVVar10->vTable != (Vec_Int_t *)0x0) || (pVVar10->vNexts != (Vec_Int_t *)0x0)) {
        __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
      }
      uVar13 = 9999;
      while( true ) {
        do {
          uVar17 = uVar13;
          uVar13 = uVar17 + 1;
        } while ((uVar17 & 1) != 0);
        if (uVar13 < 9) break;
        iVar18 = 5;
        while (uVar13 % (iVar18 - 2U) != 0) {
          uVar2 = iVar18 * iVar18;
          iVar18 = iVar18 + 2;
          if (uVar13 < uVar2) goto LAB_0041db99;
        }
      }
LAB_0041db99:
      pVVar9 = (Vec_Int_t *)malloc(0x10);
      uVar2 = uVar13;
      if (uVar17 < 0xf) {
        uVar2 = 0x10;
      }
      pVVar9->nSize = 0;
      pVVar9->nCap = uVar2;
      piVar7 = (int *)malloc((long)(int)uVar2 << 2);
      pVVar9->pArray = piVar7;
      pVVar9->nSize = uVar13;
      if (piVar7 != (int *)0x0) {
        memset(piVar7,0xff,(long)(int)uVar13 << 2);
      }
      pVVar10->vTable = pVVar9;
      pVVar9 = (Vec_Int_t *)malloc(0x10);
      pVVar9->nCap = 10000;
      pVVar9->nSize = 0;
      piVar7 = (int *)malloc(40000);
      pVVar9->pArray = piVar7;
      pVVar10->vNexts = pVVar9;
      pVVar11 = (Vec_Ptr_t *)malloc(0x10);
      pVVar11->nCap = 1000;
      pVVar11->nSize = 0;
      ppvVar6 = (void **)malloc(8000);
      pVVar11->pArray = ppvVar6;
      p->vTtDecs[uVar16] = pVVar11;
      uVar16 = uVar16 + 1;
    } while (uVar16 != nVars + 1);
  }
  if (2 < nVars) {
    lVar15 = 0;
    do {
      piVar7 = Extra_GreyCodeSchedule((int)lVar15 + 2);
      p->pSched[lVar15 + 2] = piVar7;
      lVar15 = lVar15 + 1;
    } while ((ulong)(uint)nVars - 2 != lVar15);
  }
  if (LutSize != 0) {
    pvVar12 = If_ManSatBuildXY(LutSize);
    p->pSat = pvVar12;
  }
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0;
  pVVar9->nSize = 0;
  pVVar9->pArray = (int *)0x0;
  p->vCover = pVVar9;
  return p;
}

Assistant:

If_DsdMan_t * If_DsdManAlloc( int nVars, int LutSize )
{
    If_DsdMan_t * p; int v;
    char pFileName[100];
    assert( nVars <= DAU_MAX_VAR );
    sprintf( pFileName, "%02d.dsd", nVars );
    p = ABC_CALLOC( If_DsdMan_t, 1 );
    p->pStore  = Abc_UtilStrsav( pFileName );
    p->nVars   = nVars;
    p->LutSize = LutSize;
    p->nWords  = Abc_TtWordNum( nVars );
    p->nBins   = Abc_PrimeCudd( 100000 );
    p->pBins   = ABC_CALLOC( unsigned, p->nBins );
    p->pMem    = Mem_FlexStart();
    p->nConfigWords = 1;
    Vec_PtrGrow( &p->vObjs, 10000 );
    Vec_IntGrow( &p->vNexts, 10000 );
    Vec_IntGrow( &p->vTruths, 10000 );
    If_DsdObjAlloc( p, IF_DSD_CONST0, 0 );
    If_DsdObjAlloc( p, IF_DSD_VAR, 0 )->nSupp = 1;
    p->vTemp1   = Vec_IntAlloc( 32 );
    p->vTemp2   = Vec_IntAlloc( 32 );
    p->pTtElems = If_ManDsdTtElems();
    for ( v = 3; v <= nVars; v++ )
    {
        p->vTtMem[v] = Vec_MemAlloc( Abc_TtWordNum(v), 12 );
        Vec_MemHashAlloc( p->vTtMem[v], 10000 );
        p->vTtDecs[v] = Vec_PtrAlloc( 1000 );
    }
/*
    p->pTtGia   = Gia_ManStart( nVars );
    Gia_ManHashAlloc( p->pTtGia );
    for ( v = 0; v < nVars; v++ )
        Gia_ManAppendCi( p->pTtGia );
*/
    for ( v = 2; v < nVars; v++ )
        p->pSched[v] = Extra_GreyCodeSchedule( v );
    if ( LutSize )
    p->pSat     = If_ManSatBuildXY( LutSize );
    p->vCover   = Vec_IntAlloc( 0 );
    return p;
}